

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

int cram_huffman_decode_int0(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  int iVar1;
  int32_t iVar2;
  undefined1 auVar3 [16];
  long lVar4;
  int iVar6;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  long lVar8;
  
  auVar3 = _DAT_00159800;
  iVar1 = *out_size;
  if (0 < (long)iVar1) {
    iVar2 = ((c->field_6).huffman.codes)->symbol;
    lVar4 = (long)iVar1 + -1;
    auVar5._8_4_ = (int)lVar4;
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
    lVar4 = 0;
    auVar5 = auVar5 ^ _DAT_00159800;
    auVar7 = _DAT_001597e0;
    auVar9 = _DAT_001597f0;
    do {
      auVar10 = auVar9 ^ auVar3;
      iVar6 = auVar5._4_4_;
      if ((bool)(~(auVar10._4_4_ == iVar6 && auVar5._0_4_ < auVar10._0_4_ || iVar6 < auVar10._4_4_)
                & 1)) {
        *(int32_t *)(out + lVar4) = iVar2;
      }
      if ((auVar10._12_4_ != auVar5._12_4_ || auVar10._8_4_ <= auVar5._8_4_) &&
          auVar10._12_4_ <= auVar5._12_4_) {
        *(int32_t *)(out + lVar4 + 4) = iVar2;
      }
      auVar10 = auVar7 ^ auVar3;
      iVar11 = auVar10._4_4_;
      if (iVar11 <= iVar6 && (iVar11 != iVar6 || auVar10._0_4_ <= auVar5._0_4_)) {
        *(int32_t *)(out + lVar4 + 8) = iVar2;
        *(int32_t *)(out + lVar4 + 0xc) = iVar2;
      }
      lVar8 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar8 + 4;
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 4;
      auVar7._8_8_ = lVar8 + 4;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(iVar1 + 3U >> 2) << 4 != lVar4);
  }
  return 0;
}

Assistant:

int cram_huffman_decode_int0(cram_slice *slice, cram_codec *c,
			     cram_block *in, char *out, int *out_size) {
    int32_t *out_i = (int32_t *)out;
    int i, n;
    const cram_huffman_code * const codes = c->huffman.codes;

    /* Special case of 0 length codes */
    for (i = 0, n = *out_size; i < n; i++) {
	out_i[i] = codes[0].symbol;
    }
    return 0;
}